

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_Plane>::Move(ON_SimpleArray<ON_Plane> *this,int dest_i,int src_i,int ele_cnt)

{
  int local_20;
  int capacity;
  int ele_cnt_local;
  int src_i_local;
  int dest_i_local;
  ON_SimpleArray<ON_Plane> *this_local;
  
  if ((((0 < ele_cnt) && (-1 < src_i)) && (-1 < dest_i)) &&
     (((src_i != dest_i && (src_i + ele_cnt <= this->m_count)) && (dest_i <= this->m_count)))) {
    local_20 = dest_i + ele_cnt;
    if (this->m_capacity < local_20) {
      if (SBORROW4(local_20,this->m_capacity * 2) != local_20 + this->m_capacity * -2 < 0) {
        local_20 = this->m_capacity << 1;
      }
      SetCapacity(this,(long)local_20);
    }
    memmove(this->m_a + dest_i,this->m_a + src_i,(long)ele_cnt << 7);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Move( int dest_i, int src_i, int ele_cnt )
{
  // private function for moving blocks of array memory
  // caller is responsible for updating m_count.
  if ( ele_cnt <= 0 || src_i < 0 || dest_i < 0 || src_i == dest_i || 
       src_i + ele_cnt > m_count || dest_i > m_count )
    return;

  int capacity = dest_i + ele_cnt;
  if ( capacity > m_capacity ) {
    if ( capacity < 2*m_capacity )
      capacity = 2*m_capacity;
    SetCapacity( capacity );
  }

  memmove( (void*)&m_a[dest_i], (void*)&m_a[src_i], ele_cnt*sizeof(T) );
}